

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pack.cpp
# Opt level: O2

ItemThing * leave_pack(ItemThing *obj,bool newobj,bool all)

{
  int iVar1;
  ItemThing *this;
  long lVar2;
  ItemThing *pIVar3;
  byte bVar4;
  ItemThing *obj_local;
  
  bVar4 = 0;
  obj_local = obj;
  if (obj->count < 2 || all) {
    last_pick = (ItemThing *)0x0;
    *(undefined1 *)((long)&fire_bolt::spotpos[1].y + (long)obj->packch + 3) = 0;
    std::__cxx11::list<ItemThing_*,_std::allocator<ItemThing_*>_>::remove
              (&player.pack,(char *)&obj_local);
  }
  else {
    last_pick = obj;
    obj->count = obj->count + -1;
    if (newobj) {
      this = (ItemThing *)operator_new(0x48);
      ItemThing::ItemThing(this);
      pIVar3 = this;
      for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
        iVar1 = (obj->pos).x;
        pIVar3->type = obj->type;
        (pIVar3->pos).x = iVar1;
        obj = (ItemThing *)((long)obj + (ulong)bVar4 * -0x10 + 8);
        pIVar3 = (ItemThing *)((long)pIVar3 + (ulong)bVar4 * -0x10 + 8);
      }
      this->count = 1;
      obj = this;
    }
  }
  return obj;
}

Assistant:

ItemThing * leave_pack(ItemThing *obj, bool newobj, bool all)
{
    ItemThing *nobj;

    nobj = obj;
    if (obj->count > 1 && !all)
    {
        last_pick = obj;
        obj->count--;
        if (newobj)
        {
            nobj = new ItemThing();
            *nobj = *obj;
            nobj->count = 1;
        }
    }
    else
    {
        last_pick = nullptr;
        pack_used[obj->packch - 'a'] = false;
        player.pack.remove(obj);
    }
    return nobj;
}